

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

_Bool MatrixCompare(Matrix *a,Matrix *b)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  _Bool _Var3;
  
  uVar1 = a->rows;
  if ((uVar1 == b->rows) && (a->columns == b->columns)) {
    iVar2 = bcmp(a->matrix,b->matrix,(ulong)uVar1 * (ulong)a->columns * 0x10);
    _Var3 = iVar2 == 0;
  }
  else {
    _Var3 = false;
    fprintf(_stderr,"%s: Invalid dimension (%dx%d == %dx%d)\n","MatrixCompare",(ulong)uVar1,
            (ulong)a->columns,(ulong)b->rows,CONCAT44((int)((ulong)in_RAX >> 0x20),b->columns));
  }
  return _Var3;
}

Assistant:

bool MatrixCompare(const Matrix *a, const Matrix *b) {
#ifndef NDEBUG
  if (a->rows != b->rows || a->columns != b->columns) {
    fprintf(stderr, "%s: Invalid dimension (%dx%d == %dx%d)\n", __FUNCTION_NAME__, a->rows, a->columns, b->rows, b->columns);
    return false;
  }
#endif
  return memcmp(a->matrix, b->matrix, sizeof(Real) * a->rows * a->columns) == 0 ? true : false;
}